

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenIndex
BinaryenCallAppendOperand(BinaryenExpressionRef expr,BinaryenExpressionRef operandExpr)

{
  bool bVar1;
  size_t sVar2;
  size_t index;
  ExpressionList *list;
  Expression *expression;
  BinaryenExpressionRef operandExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Call>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Call>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x8ea,
                  "BinaryenIndex BinaryenCallAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (operandExpr != (BinaryenExpressionRef)0x0) {
    sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       (expr + 1));
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 1),
               operandExpr);
    return (BinaryenIndex)sVar2;
  }
  __assert_fail("operandExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x8eb,
                "BinaryenIndex BinaryenCallAppendOperand(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

BinaryenIndex BinaryenCallAppendOperand(BinaryenExpressionRef expr,
                                        BinaryenExpressionRef operandExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Call>());
  assert(operandExpr);
  auto& list = static_cast<Call*>(expression)->operands;
  auto index = list.size();
  list.push_back((Expression*)operandExpr);
  return index;
}